

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall metaf::TrendGroup::isTrendTimeGroup(TrendGroup *this)

{
  bool bVar1;
  
  if ((this->t - FROM < 3) && (this->prob == NONE)) {
    bVar1 = (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::MetafTime>._M_engaged;
    if (((this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0) {
      if (((bVar1 & 1U) == 0) &&
         (((this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) {
        return false;
      }
    }
    else {
      if ((bVar1 & 1U) != 0) {
        return false;
      }
      if (((this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0) {
        return false;
      }
    }
    if (((bVar1 & 1U) == 0) ||
       (((this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

Type type() const { return t; }